

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

void __thiscall amrex::MFIter::~MFIter(MFIter *this)

{
  bool bVar1;
  unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *unaff_retaddr;
  bool in_stack_0000002f;
  FabArrayBase *in_stack_00000030;
  
  depth = 0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                     0x12ce5d2);
  if (bVar1) {
    std::unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>::operator->
              ((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
               0x12ce5e2);
    FabArrayBase::clearThisBD(in_stack_00000030,in_stack_0000002f);
  }
  std::unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>::~unique_ptr
            (unaff_retaddr);
  return;
}

Assistant:

MFIter::~MFIter ()
{
#ifdef AMREX_USE_OMP
#pragma omp master
#endif
    {
        depth = 0;
    }

#ifdef BL_USE_TEAM
    if ( ! (flags & NoTeamBarrier) )
        ParallelDescriptor::MyTeam().MemoryBarrier();
#endif

#ifdef AMREX_USE_GPU
    if (device_sync) Gpu::streamSynchronizeAll();
#endif

#ifdef AMREX_USE_GPU
    AMREX_GPU_ERROR_CHECK();
    Gpu::Device::resetStreamIndex();
#endif

    if (m_fa) {
#ifdef AMREX_USE_OMP
#pragma omp barrier
#pragma omp single
#endif
        m_fa->clearThisBD();
    }
}